

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

Curl_multi * Curl_multi_handle(int hashsize,int chashsize,int dnssize)

{
  int iVar1;
  Curl_multi *pCVar2;
  
  pCVar2 = (Curl_multi *)(*Curl_ccalloc)(1,0x1b8);
  if (pCVar2 != (Curl_multi *)0x0) {
    pCVar2->magic = 0xbab1e;
    Curl_init_dnscache(&pCVar2->hostcache,dnssize);
    Curl_hash_init(&pCVar2->sockhash,hashsize,hash_fd,fd_key_compare,sh_freeentry);
    iVar1 = Curl_conncache_init(&pCVar2->conn_cache,chashsize);
    if (iVar1 == 0) {
      Curl_llist_init(&pCVar2->msglist,(Curl_llist_dtor)0x0);
      Curl_llist_init(&pCVar2->pending,(Curl_llist_dtor)0x0);
      Curl_llist_init(&pCVar2->msgsent,(Curl_llist_dtor)0x0);
      pCVar2->field_0x1b1 = pCVar2->field_0x1b1 | 1;
      pCVar2->max_concurrent_streams = 100;
      iVar1 = pipe(pCVar2->wakeup_pair);
      if (-1 < iVar1) {
        iVar1 = curlx_nonblock(pCVar2->wakeup_pair[0],1);
        if ((-1 < iVar1) && (iVar1 = curlx_nonblock(pCVar2->wakeup_pair[1],1), -1 < iVar1)) {
          return pCVar2;
        }
        close(pCVar2->wakeup_pair[0]);
        close(pCVar2->wakeup_pair[1]);
      }
      pCVar2->wakeup_pair[0] = -1;
      pCVar2->wakeup_pair[1] = -1;
      return pCVar2;
    }
    sockhash_destroy(&pCVar2->sockhash);
    Curl_hash_destroy(&pCVar2->hostcache);
    Curl_conncache_destroy(&pCVar2->conn_cache);
    (*Curl_cfree)(pCVar2);
  }
  return (Curl_multi *)0x0;
}

Assistant:

struct Curl_multi *Curl_multi_handle(int hashsize, /* socket hash */
                                     int chashsize, /* connection hash */
                                     int dnssize) /* dns hash */
{
  struct Curl_multi *multi = calloc(1, sizeof(struct Curl_multi));

  if(!multi)
    return NULL;

  multi->magic = CURL_MULTI_HANDLE;

  Curl_init_dnscache(&multi->hostcache, dnssize);

  sh_init(&multi->sockhash, hashsize);

  if(Curl_conncache_init(&multi->conn_cache, chashsize))
    goto error;

  Curl_llist_init(&multi->msglist, NULL);
  Curl_llist_init(&multi->pending, NULL);
  Curl_llist_init(&multi->msgsent, NULL);

  multi->multiplexing = TRUE;
  multi->max_concurrent_streams = 100;

#ifdef USE_WINSOCK
  multi->wsa_event = WSACreateEvent();
  if(multi->wsa_event == WSA_INVALID_EVENT)
    goto error;
#else
#ifdef ENABLE_WAKEUP
  if(wakeup_create(multi->wakeup_pair) < 0) {
    multi->wakeup_pair[0] = CURL_SOCKET_BAD;
    multi->wakeup_pair[1] = CURL_SOCKET_BAD;
  }
  else if(curlx_nonblock(multi->wakeup_pair[0], TRUE) < 0 ||
          curlx_nonblock(multi->wakeup_pair[1], TRUE) < 0) {
    wakeup_close(multi->wakeup_pair[0]);
    wakeup_close(multi->wakeup_pair[1]);
    multi->wakeup_pair[0] = CURL_SOCKET_BAD;
    multi->wakeup_pair[1] = CURL_SOCKET_BAD;
  }
#endif
#endif

  return multi;

error:

  sockhash_destroy(&multi->sockhash);
  Curl_hash_destroy(&multi->hostcache);
  Curl_conncache_destroy(&multi->conn_cache);
  free(multi);
  return NULL;
}